

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O0

void __thiscall Updater::setUpdateAvailable(Updater *this,bool available)

{
  Downloader *pDVar1;
  bool bVar2;
  int iVar3;
  QString *file;
  QLatin1Char local_2eb;
  QChar local_2ea;
  QString local_2e8;
  QString local_2d0;
  QString local_2b8;
  QString local_2a0;
  QString local_288;
  QString local_270;
  QFlags<QMessageBox::StandardButton> local_254;
  QString local_250;
  QUrl local_238;
  QString local_230;
  QUrl local_218;
  QUrl url;
  QString local_208;
  QString local_1f0;
  QList<QString> local_1d8;
  QString local_1c0;
  QString local_1a8;
  QUrl local_190;
  QString local_188;
  Int local_170;
  QLatin1Char local_16b;
  QChar local_16a;
  QString local_168;
  QLatin1Char local_14b;
  QChar local_14a;
  QString local_148;
  QString local_130;
  QString local_118;
  QString local_100;
  QString local_e8;
  undefined1 local_d0 [8];
  QString title;
  QString local_b0;
  QString local_98;
  QString local_80;
  undefined1 local_68 [8];
  QString text;
  QMessageBox local_40 [8];
  QMessageBox box;
  bool available_local;
  Updater *this_local;
  
  this->m_updateAvailable = available;
  QMessageBox::QMessageBox(local_40,(QWidget *)0x0);
  QMessageBox::setTextFormat((TextFormat)local_40);
  QMessageBox::setIcon((Icon)local_40);
  bVar2 = updateAvailable(this);
  if ((bVar2) && ((bVar2 = notifyOnUpdate(this), bVar2 || (bVar2 = notifyOnFinish(this), bVar2)))) {
    tr((QString *)local_68,"Would you like to download the update now?",(char *)0x0,-1);
    if ((this->m_mandatoryUpdate & 1U) != 0) {
      tr(&local_80,
         "Would you like to download the update now?<br />This is a mandatory update, exiting now will close the application."
         ,(char *)0x0,-1);
      QString::operator=((QString *)local_68,&local_80);
      QString::~QString(&local_80);
    }
    QString::operator+=((QString *)local_68,"<br/><br/>");
    bVar2 = QString::isEmpty(&this->m_changelog);
    if (!bVar2) {
      tr(&local_b0,"<strong>Change log:</strong><br/>%1",(char *)0x0,-1);
      QLatin1Char::QLatin1Char((QLatin1Char *)((long)&title.d.size + 5),' ');
      QChar::QChar((QChar *)((long)&title.d.size + 6),title.d.size._5_1_);
      QString::arg((QString *)&local_98,(int)&local_b0,(QChar *)&this->m_changelog);
      QString::operator+=((QString *)local_68,&local_98);
      QString::~QString(&local_98);
      QString::~QString(&local_b0);
    }
    tr(&local_130,"Version %1 of %2 has been released!",(char *)0x0,-1);
    latestVersion(&local_148,this);
    QLatin1Char::QLatin1Char(&local_14b,' ');
    QChar::QChar(&local_14a,local_14b);
    QString::arg((QString *)&local_118,(int)&local_130,(QChar *)&local_148);
    moduleName(&local_168,this);
    QLatin1Char::QLatin1Char(&local_16b,' ');
    QChar::QChar(&local_16a,local_16b);
    QString::arg((QString *)&local_100,(int)&local_118,(QChar *)&local_168);
    operator+(&local_e8,"<h3>",&local_100);
    operator+((QString *)local_d0,&local_e8,"</h3>");
    QString::~QString(&local_e8);
    QString::~QString(&local_100);
    QString::~QString(&local_168);
    QString::~QString(&local_118);
    QString::~QString(&local_148);
    QString::~QString(&local_130);
    QMessageBox::setText((QString *)local_40);
    QMessageBox::setInformativeText((QString *)local_40);
    local_170 = (Int)operator|(No,Yes);
    QMessageBox::setStandardButtons((QFlags_conflict1 *)local_40);
    QMessageBox::setDefaultButton((StandardButton)local_40);
    iVar3 = QDialog::exec();
    if (iVar3 == 0x4000) {
      openUrl(&local_188,this);
      bVar2 = QString::isEmpty(&local_188);
      QString::~QString(&local_188);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bVar2 = downloaderEnabled(this);
        if (bVar2) {
          pDVar1 = this->m_downloader;
          Updater::url(&local_1c0,this);
          Downloader::setUrlId(pDVar1,&local_1c0);
          QString::~QString(&local_1c0);
          pDVar1 = this->m_downloader;
          downloadUrl(&local_1f0,this);
          QString::QString(&local_208,"/");
          QFlags<Qt::SplitBehaviorFlags>::QFlags
                    ((QFlags<Qt::SplitBehaviorFlags> *)((long)&url.d + 4),KeepEmptyParts);
          QString::split((QString *)&local_1d8,(QFlags_conflict1 *)&local_1f0,
                         (CaseSensitivity)&local_208);
          file = QList<QString>::last(&local_1d8);
          Downloader::setFileName(pDVar1,file);
          QList<QString>::~QList(&local_1d8);
          QString::~QString(&local_208);
          QString::~QString(&local_1f0);
          Downloader::setMandatoryUpdate(this->m_downloader,(bool)(this->m_mandatoryUpdate & 1));
          downloadUrl(&local_230,this);
          QUrl::QUrl(&local_218,(QString *)&local_230,TolerantMode);
          QString::~QString(&local_230);
          QUrl::setUserName((QString *)&local_218,(int)this + 0xf0);
          QUrl::setPassword((QString *)&local_218,(int)this + 0x108);
          Downloader::startDownload(this->m_downloader,&local_218);
          QUrl::~QUrl(&local_218);
        }
        else {
          downloadUrl(&local_250,this);
          QUrl::QUrl(&local_238,(QString *)&local_250,TolerantMode);
          QDesktopServices::openUrl((QUrl *)&local_238);
          QUrl::~QUrl(&local_238);
          QString::~QString(&local_250);
        }
      }
      else {
        openUrl(&local_1a8,this);
        QUrl::QUrl(&local_190,(QString *)&local_1a8,TolerantMode);
        QDesktopServices::openUrl((QUrl *)&local_190);
        QUrl::~QUrl(&local_190);
        QString::~QString(&local_1a8);
      }
    }
    else if ((this->m_mandatoryUpdate & 1U) != 0) {
      QCoreApplication::quit();
    }
    QString::~QString((QString *)local_d0);
    QString::~QString((QString *)local_68);
  }
  else {
    bVar2 = notifyOnFinish(this);
    if (bVar2) {
      QFlags<QMessageBox::StandardButton>::QFlags(&local_254,Close);
      QMessageBox::setStandardButtons((QFlags_conflict1 *)local_40);
      tr(&local_270,"No updates are available for the moment",(char *)0x0,-1);
      QMessageBox::setInformativeText((QString *)local_40);
      QString::~QString(&local_270);
      tr(&local_2d0,"Congratulations! You are running the latest version of %1",(char *)0x0,-1);
      moduleName(&local_2e8,this);
      QLatin1Char::QLatin1Char(&local_2eb,' ');
      QChar::QChar(&local_2ea,local_2eb);
      QString::arg((QString *)&local_2b8,(int)&local_2d0,(QChar *)&local_2e8);
      operator+(&local_2a0,"<h3>",&local_2b8);
      operator+(&local_288,&local_2a0,"</h3>");
      QMessageBox::setText((QString *)local_40);
      QString::~QString(&local_288);
      QString::~QString(&local_2a0);
      QString::~QString(&local_2b8);
      QString::~QString(&local_2e8);
      QString::~QString(&local_2d0);
      QDialog::exec();
    }
  }
  QMessageBox::~QMessageBox(local_40);
  return;
}

Assistant:

void Updater::setUpdateAvailable(const bool available)
{
   m_updateAvailable = available;

   QMessageBox box;
   box.setTextFormat(Qt::RichText);
   box.setIcon(QMessageBox::Information);

   if (updateAvailable() && (notifyOnUpdate() || notifyOnFinish()))
   {
      QString text = tr("Would you like to download the update now?");
      if (m_mandatoryUpdate)
      {
         text = tr("Would you like to download the update now?<br />This is a mandatory update, exiting now will close "
                   "the application.");
      }
      text += "<br/><br/>";
      if (!m_changelog.isEmpty())
         text += tr("<strong>Change log:</strong><br/>%1").arg(m_changelog);

      QString title
          = "<h3>" + tr("Version %1 of %2 has been released!").arg(latestVersion()).arg(moduleName()) + "</h3>";

      box.setText(title);
      box.setInformativeText(text);
      box.setStandardButtons(QMessageBox::No | QMessageBox::Yes);
      box.setDefaultButton(QMessageBox::Yes);

      if (box.exec() == QMessageBox::Yes)
      {
         if (!openUrl().isEmpty())
            QDesktopServices::openUrl(QUrl(openUrl()));

         else if (downloaderEnabled())
         {
            m_downloader->setUrlId(url());
            m_downloader->setFileName(downloadUrl().split("/").last());
            m_downloader->setMandatoryUpdate(m_mandatoryUpdate);
            auto url = QUrl(downloadUrl());
            url.setUserName(m_downloadUserName);
            url.setPassword(m_downloadPassword);
            m_downloader->startDownload(url);
         }

         else
            QDesktopServices::openUrl(QUrl(downloadUrl()));
      }
      else
      {
         if (m_mandatoryUpdate)
         {
            QApplication::quit();
         }
      }
   }

   else if (notifyOnFinish())
   {
      box.setStandardButtons(QMessageBox::Close);
      box.setInformativeText(tr("No updates are available for the moment"));
      box.setText("<h3>"
                  + tr("Congratulations! You are running the "
                       "latest version of %1")
                        .arg(moduleName())
                  + "</h3>");

      box.exec();
   }
}